

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  id local_38;
  mutex_type *local_30;
  native_handle_type local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  id tid;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._M_device = (mutex_type *)std::this_thread::get_id();
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx_);
  local_28 = (this->e_owner_)._M_thread;
  local_30 = lk._M_device;
  bVar1 = std::operator!=((id)local_28,(id)lk._M_device);
  if (!bVar1) {
    std::thread::id::id(&local_38);
    (this->e_owner_)._M_thread = local_38._M_thread;
    rwlock::ReaderPrefer::release_wlock(&this->state_);
    validator::deadlock::unlocked((uintptr_t)this,(id)lk._M_device,false);
    std::condition_variable::notify_all();
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    return;
  }
  abort();
}

Assistant:

void unlock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ != tid) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock");
#endif
    }
    e_owner_ = {};
    RwLockPolicy::release_wlock(state_);
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, false);
    cv_.notify_all();
  }